

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O3

void sprintf<char_const*,char_const*>(stringstream *oss,string *fmt,char *value,char *args)

{
  ostream *poVar1;
  ostream *poVar2;
  char cVar3;
  int iVar4;
  pointer pcVar5;
  long lVar6;
  long lVar7;
  char *__nptr;
  char *__nptr_00;
  bool bVar8;
  char *pcVar9;
  byte bVar10;
  runtime_error *prVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [12];
  string local_68;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_38 = value;
  if (fmt->_M_string_length != 0) {
    poVar1 = (ostream *)(oss + 0x10);
    uVar16 = 0;
    do {
      pcVar5 = (fmt->_M_dataplus)._M_p;
      cVar3 = pcVar5[uVar16];
      uVar14 = uVar16;
      if ((cVar3 == '%') && (uVar14 = uVar16 + 1, pcVar5[uVar16 + 1] != '%')) {
        uVar16 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar14);
        local_40 = args;
        if (uVar16 <= uVar14) {
          bVar8 = false;
          uVar15 = uVar14;
          goto LAB_001186e4;
        }
        bVar8 = false;
        goto LAB_00118611;
      }
      local_68._M_dataplus._M_p._0_1_ = cVar3;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_68,1);
      uVar16 = uVar14 + 1;
    } while (uVar16 < fmt->_M_string_length);
  }
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar11,"extra arguments provided to sprintf");
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
LAB_00118611:
  do {
    bVar10 = (fmt->_M_dataplus)._M_p[uVar14];
    uVar15 = uVar14;
    if (bVar10 < 0x2b) {
      if (bVar10 != 0x20) {
        if (bVar10 != 0x23) break;
        bVar8 = true;
      }
    }
    else if (bVar10 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar10 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar10 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar2 = poVar1 + *(long *)(*(long *)poVar1 + -0x18);
        if (oss[*(long *)(*(long *)poVar1 + -0x18) + 0xf1] == (stringstream)0x0) {
          std::ios::widen((char)poVar2);
          poVar2[0xe1] = (ostream)0x1;
        }
        poVar2[0xe0] = (ostream)0x30;
      }
    }
    uVar14 = uVar14 + 1;
    uVar15 = uVar16;
  } while (uVar16 != uVar14);
LAB_001186e4:
  std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
  __nptr = (char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p);
  piVar12 = __errno_location();
  iVar4 = *piVar12;
  *piVar12 = 0;
  lVar13 = strtol(__nptr,&local_48,10);
  pcVar9 = local_48;
  if (local_48 == __nptr) {
    std::__throw_invalid_argument("stoi");
LAB_0011892e:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar13 - 0x80000000U < 0xffffffff00000000) || (*piVar12 == 0x22)) goto LAB_0011892e;
    if (*piVar12 == 0) {
      *piVar12 = iVar4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
        &local_68.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p),
                      local_68.field_2._M_allocated_capacity + 1);
    }
    *(long *)(oss + *(long *)(*(long *)poVar1 + -0x18) + 0x20) = lVar13;
    bVar10 = pcVar9[(long)((fmt->_M_dataplus)._M_p + (uVar15 - (long)__nptr))];
    lVar13 = 0;
    if (bVar10 != 0x2e) {
LAB_00118872:
      if ((bVar10 | 0x20) == 0x78) {
        lVar6 = *(long *)poVar1;
        lVar7 = *(long *)(lVar6 + -0x18);
        *(uint *)(oss + lVar7 + 0x28) = *(uint *)(oss + lVar7 + 0x28) & 0xffffffb5 | 8;
        if (bVar8) {
          *(uint *)(oss + *(long *)(lVar6 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar6 + -0x18) + 0x28) | 0x200;
        }
      }
      streamout(oss,local_38,(int)lVar13);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
      sprintf<char_const*>(oss,&local_68,local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
          &local_68.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p),
                        local_68.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__cxx11::string::substr((ulong)&local_68,(ulong)fmt);
    __nptr_00 = (char *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p);
    piVar12 = __errno_location();
    iVar4 = *piVar12;
    *piVar12 = 0;
    lVar13 = strtol(__nptr_00,&local_48,10);
    if (local_48 != __nptr_00) {
      if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar12 != 0x22)) {
        if (*piVar12 == 0) {
          *piVar12 = iVar4;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p) !=
            &local_68.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_68._M_dataplus._M_p._1_7_,(char)local_68._M_dataplus._M_p),
                          local_68.field_2._M_allocated_capacity + 1);
        }
        bVar10 = local_48[(long)(pcVar9 + (long)((fmt->_M_dataplus)._M_p +
                                                (((uVar15 - (long)__nptr) + 1) - (long)__nptr_00)))]
        ;
        goto LAB_00118872;
      }
      goto LAB_00118946;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00118946:
  auVar17 = std::__throw_out_of_range("stoi");
  if (auVar17._8_4_ != 1) {
    _Unwind_Resume(auVar17._0_8_);
  }
  __cxa_begin_catch(auVar17._0_8_);
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar11,"Expected precision value in sprintf");
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}